

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_rational.hpp
# Opt level: O2

void soplex::LPFwriteSVector
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *p_lp,ostream *p_output,NameSet *p_cnames,
               SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               *p_svec,SPxOut *spxout,bool writeZeroCoefficients)

{
  type_conflict5 tVar1;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  int i;
  int iVar5;
  Verbosity old_verbosity;
  char name [16];
  Rational coeff;
  long local_d0;
  undefined4 local_bc;
  NameSet *local_b8;
  string local_b0;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_90;
  char local_88 [16];
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  local_78;
  
  local_b8 = p_cnames;
  local_90 = p_svec;
  local_d0 = std::ostream::tellp();
  iVar5 = 0;
  i = 0;
  do {
    if ((p_lp->
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        .set.thenum <= i) {
      return;
    }
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::operator[]((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                  *)&local_78,local_90,i);
    local_b0._M_dataplus._M_p = local_b0._M_dataplus._M_p & 0xffffffff00000000;
    tVar1 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)&local_78,(int *)&local_b0);
    if (writeZeroCoefficients || !tVar1) {
      if (iVar5 == 5) {
LAB_0012b3d3:
        std::operator<<(p_output,"\n\t");
        lVar4 = std::ostream::tellp();
        if (((spxout != (SPxOut *)0x0) && (0x10000 < lVar4 - local_d0)) &&
           (0 < (int)spxout->m_verbosity)) {
          local_b0._M_dataplus._M_p._0_4_ = spxout->m_verbosity;
          local_bc = 1;
          (*spxout->_vptr_SPxOut[2])(spxout,&local_bc);
          operator<<(spxout,
                     "XLPSWR01 Warning: SOPLEX_MAX_LINE_WRITE_LEN possibly exceeded when writing LP file\n"
                    );
          (*spxout->_vptr_SPxOut[2])(spxout,&local_b0);
        }
        local_d0 = std::ostream::tellp();
        iVar5 = 0;
LAB_0012b457:
        local_b0._M_dataplus._M_p = local_b0._M_dataplus._M_p & 0xffffffff00000000;
        tVar1 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)&local_78,(int *)&local_b0);
        if (tVar1) {
          poVar2 = std::operator<<(p_output," - ");
          local_b0._M_dataplus._M_p = (pointer)&local_78;
          boost::multiprecision::detail::operator<<
                    (poVar2,(expression<boost::multiprecision::detail::negate,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void,_void>
                             *)&local_b0);
        }
        else {
          poVar2 = std::operator<<(p_output," + ");
          boost::multiprecision::operator<<
                    (poVar2,(number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                             *)&local_78);
        }
        poVar2 = std::operator<<(p_output," ");
        pcVar3 = getColName(p_lp,i,local_b8,local_88);
        std::operator<<(poVar2,pcVar3);
      }
      else {
        if (iVar5 != 0) {
          lVar4 = std::ostream::tellp();
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
          ::str_abi_cxx11_(&local_b0,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                            *)&local_78,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
          lVar4 = (lVar4 - local_d0) + local_b0._M_string_length;
          std::__cxx11::string::~string((string *)&local_b0);
          if (0x10000 < lVar4 + 100) goto LAB_0012b3d3;
          goto LAB_0012b457;
        }
        poVar2 = boost::multiprecision::operator<<
                           (p_output,(number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                      *)&local_78);
        poVar2 = std::operator<<(poVar2," ");
        pcVar3 = getColName(p_lp,i,local_b8,local_88);
        iVar5 = 0;
        std::operator<<(poVar2,pcVar3);
      }
      iVar5 = iVar5 + 1;
    }
    boost::
    rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~rational(&local_78);
    i = i + 1;
  } while( true );
}

Assistant:

static void LPFwriteSVector(
   const SPxLPBase<Rational>&   p_lp,                         ///< the LP
   std::ostream&                p_output,                     ///< output stream
   const NameSet*               p_cnames,                     ///< column names
   const SVectorBase<Rational>& p_svec,                       ///< vector to write
   SPxOut*                      spxout,                       ///< out stream
   const bool                   writeZeroCoefficients = false ///< write zero objective coefficients
)
{

   char name[16];
   int num_coeffs = 0;
   long long pos;

   pos = p_output.tellp();

   for(int j = 0; j < p_lp.nCols(); ++j)
   {
      const Rational coeff = p_svec[j];

      if(coeff == 0 && !writeZeroCoefficients)
         continue;

      if(num_coeffs == 0)
         p_output << coeff << " " << getColName(p_lp, j, p_cnames, name);
      else
      {
         // insert a line break every SOPLEX_NUM_ENTRIES_PER_LINE columns or whenever max line length is nearly exceeded
         if(num_coeffs == SOPLEX_NUM_ENTRIES_PER_LINE ||
               (long long)(p_output.tellp()) - pos + (long long)(coeff.str().length() + 100) >
               SOPLEX_MAX_LINE_WRITE_LEN)
         {
            num_coeffs = 0;
            p_output << "\n\t";

            if((long long)(p_output.tellp()) - pos  >  SOPLEX_MAX_LINE_WRITE_LEN)
            {
               SPX_MSG_WARNING((*spxout), (*spxout) <<
                               "XLPSWR01 Warning: SOPLEX_MAX_LINE_WRITE_LEN possibly exceeded when writing LP file\n");
            }

            pos = p_output.tellp();
         }

         if(coeff < 0)
            p_output << " - " << -coeff;
         else
            p_output << " + " << coeff;

         p_output << " " << getColName(p_lp, j, p_cnames, name);
      }

      ++num_coeffs;
   }
}